

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedFixedWingAircraft.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedFixedWingAircraft::Encode
          (GED_EnhancedFixedWingAircraft *this,KDataStream *stream)

{
  GED_BasicFixedWingAircraft::Encode(&this->super_GED_BasicFixedWingAircraft,stream);
  KDataStream::Write(stream,this->m_ui8SupFuelStatus);
  KDataStream::Write(stream,this->m_ui8AirMaintStatus);
  KDataStream::Write(stream,this->m_ui8PriAmmun);
  KDataStream::Write(stream,this->m_ui8SecAmmun);
  return;
}

Assistant:

void GED_EnhancedFixedWingAircraft::Encode( KDataStream & stream ) const
{
    GED_BasicFixedWingAircraft::Encode( stream );

    stream << m_ui8SupFuelStatus
           << m_ui8AirMaintStatus
           << m_ui8PriAmmun
           << m_ui8SecAmmun;
}